

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix7.cpp
# Opt level: O2

void radix_sort7_int64(int64_t *array,size_t count)

{
  long *plVar1;
  size_t *psVar2;
  ulong *puVar3;
  int64_t *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int64_t *piVar8;
  size_t i_1;
  size_t i;
  size_t sVar9;
  int64_t *__src;
  int64_t *piVar10;
  ulong uVar11;
  long *__s;
  unique_ptr<long[],_std::default_delete<long[]>_> queue_area;
  int64_t *queue_ptrs [256];
  freq_array_type freqs;
  _Head_base<0UL,_long_*,_false> local_4840;
  long alStack_4838 [256];
  long local_4038 [2049];
  
  piVar4 = (int64_t *)operator_new__(-(ulong)(count >> 0x3d != 0) | count * 8);
  __s = local_4038;
  local_4840._M_head_impl = piVar4;
  memset(__s,0,0x4000);
  for (sVar9 = 0; sVar9 != count; sVar9 = sVar9 + 1) {
    uVar5 = array[sVar9];
    for (lVar6 = 0; lVar6 != 0x4000; lVar6 = lVar6 + 0x800) {
      plVar1 = (long *)((long)local_4038 + lVar6 + (uVar5 & 0xff) * 8);
      *plVar1 = *plVar1 + 1;
      uVar5 = uVar5 >> 8;
    }
  }
  lVar6 = 0;
  __src = array;
  do {
    if (lVar6 == 8) {
      if ((count != 0) && (__src != array)) {
        memmove(array,__src,count * 8);
      }
      std::unique_ptr<long[],_std::default_delete<long[]>_>::~unique_ptr
                ((unique_ptr<long[],_std::default_delete<long[]>_> *)&local_4840);
      return;
    }
    lVar7 = 0;
    do {
      piVar8 = __src;
      piVar10 = piVar4;
      if (lVar7 == 0x100) goto LAB_00116944;
      psVar2 = (size_t *)(__s + lVar7);
      lVar7 = lVar7 + 1;
    } while (*psVar2 == 0);
    if (*psVar2 != count) {
      piVar8 = piVar4;
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        alStack_4838[lVar7] = (long)piVar8;
        piVar8 = piVar8 + __s[lVar7];
      }
      for (sVar9 = 0; piVar8 = piVar4, piVar10 = __src, count != sVar9; sVar9 = sVar9 + 1) {
        uVar5 = __src[sVar9];
        uVar11 = uVar5 >> ((char)lVar6 * '\b' & 0x3fU) & 0xff;
        puVar3 = (ulong *)alStack_4838[uVar11];
        alStack_4838[uVar11] = (long)(puVar3 + 1);
        *puVar3 = uVar5;
      }
    }
LAB_00116944:
    lVar6 = lVar6 + 1;
    __s = __s + 0x100;
    __src = piVar8;
    piVar4 = piVar10;
  } while( true );
}

Assistant:

void radix_sort7_int64(int64_t *array, size_t count) {
  std::unique_ptr<int64_t[]> queue_area(new int64_t[count]);
  // huge_unique_ptr<uint64_t[]> queue_area = make_huge_array<uint64_t>(count,
  // false);

  freq_array_type freqs = {};
  count_frequency(array, count, freqs);

  int64_t *from = array, *to = queue_area.get();

  for (size_t pass = 0; pass < RADIX_LEVELS; pass++) {

    if (is_trivial(freqs[pass], count)) {
      // this pass would do nothing, just skip it
      continue;
    }

    int shift = pass * RADIX_BITS;

    // array of pointers to the current position in each queue, which we set up
    // based on the known final sizes of each queue (i.e., "tighly packed")
    int64_t *queue_ptrs[RADIX_SIZE], *next = to;
    for (size_t i = 0; i < RADIX_SIZE; i++) {
      queue_ptrs[i] = next;
      next += freqs[pass][i];
    }

    // copy each element into the appropriate queue based on the current
    // RADIX_BITS sized "digit" within it
    for (size_t i = 0; i < count; i++) {
      size_t value = from[i];
      size_t index = (value >> shift) & RADIX_MASK;
      *queue_ptrs[index]++ = value;
      __builtin_prefetch(queue_ptrs[index] + 1);
    }

    // swap from and to areas
    std::swap(from, to);
  }

  // because of the last swap, the "from" area has the sorted payload: if it's
  // not the original array "a", do a final copy
  if (from != array) {
    std::copy(from, from + count, array);
  }
}